

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

int av1_get_switchable_rate
              (MACROBLOCK *x,MACROBLOCKD *xd,InterpFilter interp_filter,int dual_filter)

{
  uint uVar1;
  MB_MODE_INFO *pMVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined7 in_register_00000011;
  int iVar7;
  
  iVar7 = 0;
  if ((int)CONCAT71(in_register_00000011,interp_filter) == 4) {
    pMVar2 = *xd->mi;
    iVar7 = 0;
    iVar6 = 0;
    bVar5 = true;
    do {
      bVar4 = bVar5;
      if ((bool)(dual_filter == 0 & (bVar4 ^ 1U))) {
        return iVar7;
      }
      iVar6 = av1_get_pred_context_switchable_interp(xd,iVar6);
      uVar1 = (pMVar2->interp_filters).as_int;
      uVar3 = uVar1 >> 0x10;
      if (bVar4) {
        uVar3 = uVar1;
      }
      iVar7 = iVar7 + (x->mode_costs).switchable_interp_costs[iVar6][(ulong)uVar3 & 0xff];
      iVar6 = 1;
      bVar5 = false;
    } while (bVar4);
  }
  return iVar7;
}

Assistant:

int av1_get_switchable_rate(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            InterpFilter interp_filter, int dual_filter) {
  if (interp_filter == SWITCHABLE) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    int inter_filter_cost = 0;
    for (int dir = 0; dir < 2; ++dir) {
      if (dir && !dual_filter) break;
      const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
      const InterpFilter filter =
          av1_extract_interp_filter(mbmi->interp_filters, dir);
      inter_filter_cost += x->mode_costs.switchable_interp_costs[ctx][filter];
    }
    return SWITCHABLE_INTERP_RATE_FACTOR * inter_filter_cost;
  } else {
    return 0;
  }
}